

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O2

int mbedtls_md_hmac_starts(mbedtls_md_context_t *ctx,uchar *key,size_t keylen)

{
  uchar *__s;
  mbedtls_md_info_t *pmVar1;
  int iVar2;
  size_t sVar3;
  size_t __n;
  uchar *__s_00;
  uchar sum [64];
  
  iVar2 = -0x5100;
  if (ctx != (mbedtls_md_context_t *)0x0) {
    pmVar1 = ctx->md_info;
    iVar2 = -0x5100;
    if ((pmVar1 != (mbedtls_md_info_t *)0x0) &&
       (__s_00 = (uchar *)ctx->hmac_ctx, __s_00 != (uchar *)0x0)) {
      __n = (size_t)pmVar1->block_size;
      if (__n < keylen) {
        (*pmVar1->starts_func)(ctx->md_ctx);
        (*ctx->md_info->update_func)(ctx->md_ctx,key,keylen);
        (*ctx->md_info->finish_func)(ctx->md_ctx,sum);
        __s_00 = (uchar *)ctx->hmac_ctx;
        keylen = (size_t)ctx->md_info->size;
        __n = (size_t)ctx->md_info->block_size;
        key = sum;
      }
      __s = __s_00 + __n;
      memset(__s_00,0x36,__n);
      memset(__s,0x5c,(long)ctx->md_info->block_size);
      for (sVar3 = 0; keylen != sVar3; sVar3 = sVar3 + 1) {
        __s_00[sVar3] = __s_00[sVar3] ^ key[sVar3];
        __s[sVar3] = __s[sVar3] ^ key[sVar3];
      }
      mbedtls_zeroize(sum,0x40);
      (*ctx->md_info->starts_func)(ctx->md_ctx);
      (*ctx->md_info->update_func)(ctx->md_ctx,__s_00,(long)ctx->md_info->block_size);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_md_hmac_starts( mbedtls_md_context_t *ctx, const unsigned char *key, size_t keylen )
{
    unsigned char sum[MBEDTLS_MD_MAX_SIZE];
    unsigned char *ipad, *opad;
    size_t i;

    if( ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    if( keylen > (size_t) ctx->md_info->block_size )
    {
        ctx->md_info->starts_func( ctx->md_ctx );
        ctx->md_info->update_func( ctx->md_ctx, key, keylen );
        ctx->md_info->finish_func( ctx->md_ctx, sum );

        keylen = ctx->md_info->size;
        key = sum;
    }

    ipad = (unsigned char *) ctx->hmac_ctx;
    opad = (unsigned char *) ctx->hmac_ctx + ctx->md_info->block_size;

    memset( ipad, 0x36, ctx->md_info->block_size );
    memset( opad, 0x5C, ctx->md_info->block_size );

    for( i = 0; i < keylen; i++ )
    {
        ipad[i] = (unsigned char)( ipad[i] ^ key[i] );
        opad[i] = (unsigned char)( opad[i] ^ key[i] );
    }

    mbedtls_zeroize( sum, sizeof( sum ) );

    ctx->md_info->starts_func( ctx->md_ctx );
    ctx->md_info->update_func( ctx->md_ctx, ipad, ctx->md_info->block_size );

    return( 0 );
}